

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

void CoreML::downgradeSpecificationVersion(Model *pModel)

{
  uint32 uVar1;
  bool bVar2;
  SupportVectorClassifier *this;
  Type *pModel_00;
  int iVar3;
  PipelineClassifier *pPVar4;
  
  if (pModel == (Model *)0x0) {
    return;
  }
  iVar3 = pModel->specificationversion_;
  if (iVar3 == 0 || 5 < iVar3) {
    pModel->specificationversion_ = 5;
LAB_002624e8:
    bVar2 = hasIOS14Features(pModel);
    if (bVar2) {
      iVar3 = pModel->specificationversion_;
      goto LAB_002624f7;
    }
    pModel->specificationversion_ = 4;
LAB_00262505:
    bVar2 = hasIOS13Features(pModel);
    if (bVar2) {
      iVar3 = pModel->specificationversion_;
      goto LAB_00262514;
    }
    pModel->specificationversion_ = 3;
LAB_00262522:
    bVar2 = hasIOS12Features(pModel);
    if (bVar2) {
      iVar3 = pModel->specificationversion_;
      goto LAB_00262531;
    }
    pModel->specificationversion_ = 2;
LAB_0026253f:
    bVar2 = hasIOS11_2Features(pModel);
    if (!bVar2) {
      pModel->specificationversion_ = 1;
    }
  }
  else {
    if (iVar3 == 5) goto LAB_002624e8;
LAB_002624f7:
    if (iVar3 == 4) goto LAB_00262505;
LAB_00262514:
    if (iVar3 == 3) goto LAB_00262522;
LAB_00262531:
    if (iVar3 == 2) goto LAB_0026253f;
  }
  uVar1 = pModel->_oneof_case_[0];
  if (uVar1 == 200) {
    pPVar4 = (pModel->Type_).pipelineclassifier_;
    this = (SupportVectorClassifier *)pPVar4->pipeline_;
    if (this != (SupportVectorClassifier *)0x0) goto LAB_002625bf;
    this = (SupportVectorClassifier *)operator_new(0x48);
    Specification::Pipeline::Pipeline((Pipeline *)this);
  }
  else {
    if (uVar1 == 0xca) {
      this = (pModel->Type_).supportvectorclassifier_;
      if (this == (SupportVectorClassifier *)0x0) {
        return;
      }
      goto LAB_002625bf;
    }
    if (uVar1 != 0xc9) {
      return;
    }
    pPVar4 = (pModel->Type_).pipelineclassifier_;
    this = (SupportVectorClassifier *)pPVar4->pipeline_;
    if (this != (SupportVectorClassifier *)0x0) goto LAB_002625bf;
    this = (SupportVectorClassifier *)operator_new(0x48);
    Specification::Pipeline::Pipeline((Pipeline *)this);
  }
  pPVar4->pipeline_ = (Pipeline *)this;
LAB_002625bf:
  if (0 < (((RepeatedPtrField<CoreML::Specification::Model> *)&this->numberofsupportvectorsperclass_
           )->super_RepeatedPtrFieldBase).current_size_) {
    iVar3 = 0;
    do {
      pModel_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                            ((RepeatedPtrFieldBase *)&this->numberofsupportvectorsperclass_,iVar3);
      downgradeSpecificationVersion(pModel_00);
      iVar3 = iVar3 + 1;
    } while (iVar3 < (((RepeatedPtrField<CoreML::Specification::Model> *)
                      &this->numberofsupportvectorsperclass_)->super_RepeatedPtrFieldBase).
                     current_size_);
  }
  return;
}

Assistant:

void CoreML::downgradeSpecificationVersion(Specification::Model *pModel) {

    if (!pModel) { return; }


    if (pModel->specificationversion() == 0 || pModel->specificationversion() > MLMODEL_SPECIFICATION_VERSION_NEWEST) {
        // If mistakenly set specification verion or never set and left as default
        // lets start at the newest specification version and downgrade from there
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_NEWEST);
    }


    if (pModel->specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS14 && !hasIOS14Features(*pModel)) {
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    }

    if (pModel->specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS13 && !hasIOS13Features(*pModel)) {
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS12);
    }

    if (pModel->specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS12 && !hasIOS12Features(*pModel)) {
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS11_2);
    }

    if (pModel->specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS11_2 && !hasIOS11_2Features(*pModel)) {
        pModel->set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS11);
    }

    ::CoreML::Specification::Pipeline *pipeline = NULL;
    auto modelType = pModel->Type_case();
    if (modelType == Specification::Model::kPipeline) {
        pipeline = pModel->mutable_pipeline();
    } else if (modelType == Specification::Model::kPipelineRegressor) {
        pipeline = pModel->mutable_pipelineregressor()->mutable_pipeline();
    } else if (modelType == Specification::Model::kPipelineClassifier) {
        pipeline = pModel->mutable_pipelineclassifier()->mutable_pipeline();
    }

    if (pipeline) {
        for (int i=0; i< pipeline->models_size(); i++) {
            downgradeSpecificationVersion(pipeline->mutable_models(i));
        }
    }

}